

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinclude.c
# Opt level: O2

void xmlXIncludeFreeContext(xmlXIncludeCtxtPtr ctxt)

{
  xmlXIncludeRefPtr *ppxVar1;
  long lVar2;
  
  if (ctxt == (xmlXIncludeCtxtPtr)0x0) {
    return;
  }
  while (0 < ctxt->urlNr) {
    xmlXIncludeURLPop(ctxt);
  }
  if (ctxt->urlTab != (xmlChar **)0x0) {
    (*xmlFree)(ctxt->urlTab);
  }
  for (lVar2 = 0; ppxVar1 = ctxt->incTab, lVar2 < ctxt->incNr; lVar2 = lVar2 + 1) {
    if (ppxVar1[lVar2] != (xmlXIncludeRefPtr)0x0) {
      xmlXIncludeFreeRef(ppxVar1[lVar2]);
    }
  }
  if (ppxVar1 != (xmlXIncludeRefPtr *)0x0) {
    (*xmlFree)(ppxVar1);
  }
  if (ctxt->txtTab != (xmlChar **)0x0) {
    for (lVar2 = 0; lVar2 < ctxt->txtNr; lVar2 = lVar2 + 1) {
      if (ctxt->txtTab[lVar2] != (xmlChar *)0x0) {
        (*xmlFree)(ctxt->txtTab[lVar2]);
      }
    }
    (*xmlFree)(ctxt->txtTab);
  }
  if (ctxt->txturlTab != (xmlURL *)0x0) {
    for (lVar2 = 0; lVar2 < ctxt->txtNr; lVar2 = lVar2 + 1) {
      if (ctxt->txturlTab[lVar2] != (xmlURL)0x0) {
        (*xmlFree)(ctxt->txturlTab[lVar2]);
      }
    }
    (*xmlFree)(ctxt->txturlTab);
  }
  if (ctxt->base != (xmlChar *)0x0) {
    (*xmlFree)(ctxt->base);
  }
  (*xmlFree)(ctxt);
  return;
}

Assistant:

void
xmlXIncludeFreeContext(xmlXIncludeCtxtPtr ctxt) {
    int i;

#ifdef DEBUG_XINCLUDE
    xmlGenericError(xmlGenericErrorContext, "Freeing context\n");
#endif
    if (ctxt == NULL)
	return;
    while (ctxt->urlNr > 0)
	xmlXIncludeURLPop(ctxt);
    if (ctxt->urlTab != NULL)
	xmlFree(ctxt->urlTab);
    for (i = 0;i < ctxt->incNr;i++) {
	if (ctxt->incTab[i] != NULL)
	    xmlXIncludeFreeRef(ctxt->incTab[i]);
    }
    if (ctxt->incTab != NULL)
	xmlFree(ctxt->incTab);
    if (ctxt->txtTab != NULL) {
	for (i = 0;i < ctxt->txtNr;i++) {
	    if (ctxt->txtTab[i] != NULL)
		xmlFree(ctxt->txtTab[i]);
	}
	xmlFree(ctxt->txtTab);
    }
    if (ctxt->txturlTab != NULL) {
	for (i = 0;i < ctxt->txtNr;i++) {
	    if (ctxt->txturlTab[i] != NULL)
		xmlFree(ctxt->txturlTab[i]);
	}
	xmlFree(ctxt->txturlTab);
    }
    if (ctxt->base != NULL) {
        xmlFree(ctxt->base);
    }
    xmlFree(ctxt);
}